

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

Variable *
rsg::anon_unknown_0::allocateNewVariable(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  ConstValueRangeAccess valueRange_00;
  ConstValueRangeAccess CVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Storage storage;
  VariableManager *pVVar7;
  VariableType *pVVar8;
  Variable *variable_00;
  ShaderParameters *pSVar9;
  Random *this;
  float fVar10;
  Scalar *in_stack_ffffffffffffff50;
  float local_94;
  float local_90;
  bool local_6f;
  bool shaderInOk;
  bool uniformOk;
  int numScalars;
  float local_48;
  float dynWeight;
  float weights [4];
  Variable *variable;
  GeneratorState *state_local;
  
  pVVar7 = GeneratorState::getVariableManager(state);
  pVVar8 = ConstValueRangeAccess::getType(&valueRange);
  variable_00 = VariableManager::allocate(pVVar7,pVVar8);
  pVVar7 = GeneratorState::getVariableManager(state);
  VariableManager::setValue(pVVar7,variable_00,valueRange);
  CVar2 = valueRange;
  valueRange_00.m_max = in_stack_ffffffffffffff50;
  valueRange_00.m_type = (VariableType *)valueRange.m_min;
  valueRange_00.m_min = valueRange.m_max;
  valueRange = CVar2;
  fVar10 = computeDynamicRangeWeight(valueRange_00);
  pVVar8 = ConstValueRangeAccess::getType(&valueRange);
  iVar4 = VariableType::getScalarSize(pVVar8);
  pVVar7 = GeneratorState::getVariableManager(state);
  iVar5 = VariableManager::getNumAllocatedUniformScalars(pVVar7);
  pSVar9 = GeneratorState::getShaderParameters(state);
  iVar1 = pSVar9->maxUniformScalars;
  pVVar8 = ConstValueRangeAccess::getType(&valueRange);
  bVar3 = isShaderInOutSupportedType(pVVar8);
  local_6f = false;
  if (bVar3) {
    pVVar7 = GeneratorState::getVariableManager(state);
    iVar6 = VariableManager::getNumAllocatedShaderInVariables(pVVar7);
    pSVar9 = GeneratorState::getShaderParameters(state);
    local_6f = iVar6 + 1 < pSVar9->maxInputVariables;
  }
  local_48 = de::max<float>(1.0 - fVar10,0.1);
  if (iVar1 < iVar5 + iVar4) {
    local_90 = 0.0;
  }
  else {
    local_90 = fVar10 * 0.5;
  }
  dynWeight = local_90;
  if (local_6f) {
    local_94 = fVar10 * 2.0;
  }
  else {
    local_94 = 0.0;
  }
  weights[1] = local_94;
  weights[0] = fVar10;
  pVVar7 = GeneratorState::getVariableManager(state);
  this = GeneratorState::getRandom(state);
  storage = de::Random::chooseWeighted<rsg::Variable::Storage,rsg::Variable::Storage_const*,float*>
                      (this,allocateNewVariable::storages,(Storage *)"texture2DLod",&local_48);
  VariableManager::setStorage(pVVar7,variable_00,storage);
  return variable_00;
}

Assistant:

Variable* allocateNewVariable (GeneratorState& state, ConstValueRangeAccess valueRange)
{
	Variable* variable = state.getVariableManager().allocate(valueRange.getType());

	// Update value range
	state.getVariableManager().setValue(variable, valueRange);

	// Random storage \todo [pyry] Check that scalar count in uniform/input classes is not exceeded
	static const Variable::Storage storages[] =
	{
		Variable::STORAGE_CONST,
		Variable::STORAGE_UNIFORM,
		Variable::STORAGE_LOCAL,
		Variable::STORAGE_SHADER_IN
	};
	float weights[DE_LENGTH_OF_ARRAY(storages)];

	// Dynamic vs. constant weight.
	float	dynWeight	= computeDynamicRangeWeight(valueRange);
	int		numScalars	= valueRange.getType().getScalarSize();
	bool	uniformOk	= state.getVariableManager().getNumAllocatedUniformScalars() + numScalars <= state.getShaderParameters().maxUniformScalars;
	bool	shaderInOk	= isShaderInOutSupportedType(valueRange.getType()) &&
						  (state.getVariableManager().getNumAllocatedShaderInVariables() + NUM_RESERVED_SHADER_INPUTS < state.getShaderParameters().maxInputVariables);

	weights[0] = de::max(1.0f-dynWeight, 0.1f);
	weights[1] = uniformOk ? dynWeight*0.5f : 0.0f;
	weights[2] = dynWeight;
	weights[3] = shaderInOk ? dynWeight*2.0f : 0.0f;

	state.getVariableManager().setStorage(variable, state.getRandom().chooseWeighted<Variable::Storage>(&storages[0], &storages[DE_LENGTH_OF_ARRAY(storages)], &weights[0]));

	return variable;
}